

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_session.c
# Opt level: O1

int nghttp2_session_adjust_idle_stream(nghttp2_session *session)

{
  nghttp2_stream *stream;
  nghttp2_stream *pnVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  nghttp2_stream **ppnVar6;
  int unaff_EBP;
  ulong uVar7;
  
  uVar3 = (session->local_settings).max_concurrent_streams;
  uVar2 = session->pending_local_max_concurrent_stream;
  if (uVar3 < session->pending_local_max_concurrent_stream) {
    uVar2 = uVar3;
  }
  uVar3 = 0x10;
  if (0x10 < uVar2) {
    uVar3 = uVar2;
  }
  uVar7 = 100;
  if (uVar3 < 100) {
    uVar7 = (ulong)uVar3;
  }
  while( true ) {
    if (session->num_idle_streams <= uVar7) {
      return 0;
    }
    stream = session->idle_stream_head;
    if (stream == (nghttp2_stream *)0x0) break;
    pnVar1 = stream->closed_next;
    iVar4 = nghttp2_session_destroy_stream(session,stream);
    iVar5 = iVar4;
    if (iVar4 == 0) {
      session->idle_stream_head = pnVar1;
      ppnVar6 = &pnVar1->closed_prev;
      if (pnVar1 == (nghttp2_stream *)0x0) {
        ppnVar6 = &session->idle_stream_tail;
      }
      *ppnVar6 = (nghttp2_stream *)0x0;
      session->num_idle_streams = session->num_idle_streams - 1;
      iVar5 = unaff_EBP;
    }
    unaff_EBP = iVar5;
    if (iVar4 != 0) {
      return iVar5;
    }
  }
  __assert_fail("head",
                "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmnghttp2/lib/nghttp2_session.c"
                ,0x6a9,"int nghttp2_session_adjust_idle_stream(nghttp2_session *)");
}

Assistant:

int nghttp2_session_adjust_idle_stream(nghttp2_session *session) {
  size_t max;
  int rv;

  /* Make minimum number of idle streams 16, and maximum 100, which
     are arbitrary chosen numbers. */
  max = nghttp2_min(
      100, nghttp2_max(
               16, nghttp2_min(session->local_settings.max_concurrent_streams,
                               session->pending_local_max_concurrent_stream)));

  DEBUGF("stream: adjusting kept idle streams num_idle_streams=%zu, max=%zu\n",
         session->num_idle_streams, max);

  while (session->num_idle_streams > max) {
    nghttp2_stream *head;
    nghttp2_stream *next;

    head = session->idle_stream_head;
    assert(head);

    next = head->closed_next;

    rv = nghttp2_session_destroy_stream(session, head);
    if (rv != 0) {
      return rv;
    }

    /* head is now destroyed */

    session->idle_stream_head = next;

    if (session->idle_stream_head) {
      session->idle_stream_head->closed_prev = NULL;
    } else {
      session->idle_stream_tail = NULL;
    }

    --session->num_idle_streams;
  }

  return 0;
}